

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O1

void __thiscall enact::AstSerialise::visitBlockExpr_abi_cxx11_(AstSerialise *this)

{
  BlockExpr *in_RDX;
  long in_RSI;
  
  visitBlockExpr_abi_cxx11_((string *)this,(AstSerialise *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

std::string AstSerialise::visitBlockExpr(BlockExpr &expr) {
        std::stringstream s;

        s << m_ident << "(Expr::Block (\n";
        m_ident += "    ";

        for (auto &statement : expr.stmts) {
            s << m_ident << visitStmt(*statement) << '\n';
        }
        s << m_ident << visitExpr(*expr.expr) << ')';

        m_ident.erase(0, 4);

        return s.str();
    }